

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

RestartSchedule
Clasp::RestartSchedule::dynamic
          (uint32 base,float k,uint32 lim,AvgType fast,Keep keep,AvgType slow,uint32 slowW)

{
  uint32 uVar1;
  RestartSchedule RVar2;
  
  uVar1 = 0xffffff;
  if (slowW < 0xffffff) {
    uVar1 = slowW;
  }
  RVar2.super_ScheduleStrategy._0_8_ =
       CONCAT44(uVar1 << 8 | (keep & keep_always) << 6 | slow * 8 | fast,base) | 0xc0000000;
  RVar2.super_ScheduleStrategy.grow = k;
  RVar2.super_ScheduleStrategy.len = lim;
  return (RestartSchedule)RVar2.super_ScheduleStrategy;
}

Assistant:

RestartSchedule RestartSchedule::dynamic(uint32 base, float k, uint32 lim, AvgType fast, Keep keep, AvgType slow, uint32 slowW) {
	RestartSchedule sched;
	sched.base = base;
	sched.type = 3u;
	sched.grow = k;
	sched.len  = lim;
	sched.idx  = uint32(fast) | (uint32(slow) << 3u) | ((keep & 3u) << 6u) | (std::min(slowW, (1u<<24)-1) << 8u);
	return sched;
}